

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowAbove(ImGuiWindow *potential_above,ImGuiWindow *potential_below)

{
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow *in_RSI;
  ImGuiWindow *in_RDI;
  ImGuiWindow *candidate_window;
  int i;
  ImGuiContext *g;
  int local_24;
  
  pIVar1 = GImGui;
  local_24 = (GImGui->Windows).Size;
  while( true ) {
    local_24 = local_24 + -1;
    if (local_24 < 0) {
      return false;
    }
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_24);
    if (*ppIVar2 == in_RDI) break;
    if (*ppIVar2 == in_RSI) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ImGui::IsWindowAbove(ImGuiWindow* potential_above, ImGuiWindow* potential_below)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* candidate_window = g.Windows[i];
        if (candidate_window == potential_above)
            return true;
        if (candidate_window == potential_below)
            return false;
    }
    return false;
}